

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O1

string * __thiscall
libtorrent::aux::print_endpoint_abi_cxx11_
          (string *__return_storage_ptr__,aux *this,address *addr,int port)

{
  char *pcVar1;
  size_t sVar2;
  char buf [200];
  string local_108;
  char local_e8 [208];
  
  if (*(int *)this == 1) {
    boost::asio::ip::address::to_string_abi_cxx11_(&local_108,(address *)this);
    pcVar1 = "  [%s]:%d";
  }
  else {
    boost::asio::ip::address::to_string_abi_cxx11_(&local_108,(address *)this);
    pcVar1 = "  %s:%d";
  }
  snprintf(local_e8,200,pcVar1 + 2,local_108._M_dataplus._M_p,(ulong)addr & 0xffffffff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(local_e8);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_e8,local_e8 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string print_endpoint(address const& addr, int port)
	{
		char buf[200];
		if (addr.is_v6())
			std::snprintf(buf, sizeof(buf), "[%s]:%d", addr.to_string().c_str(), port);
		else
			std::snprintf(buf, sizeof(buf), "%s:%d", addr.to_string().c_str(), port);
		return buf;
	}